

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O0

void __thiscall
pass_mixed_assignment_Test::~pass_mixed_assignment_Test(pass_mixed_assignment_Test *this)

{
  pass_mixed_assignment_Test *this_local;
  
  ~pass_mixed_assignment_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(pass, mixed_assignment) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &a = mod.var("a", 1);
    auto &b = mod.var("b", 1);
    mod.add_stmt(a.assign(b));
    auto seq = std::make_shared<SequentialStmtBlock>();
    seq->add_stmt(b.assign(constant(1, 1)));
    mod.add_stmt(seq);
    mod.add_stmt(b.assign(constant(1, 1)));

    fix_assignment_type(&mod);
    EXPECT_THROW(check_mixed_assignment(&mod), StmtException);
}